

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdcpp.hpp
# Opt level: O0

unique_ptr<so_5::disp::active_obj::impl::proxy_dispatcher_t,_std::default_delete<so_5::disp::active_obj::impl::proxy_dispatcher_t>_>
 __thiscall
so_5::stdcpp::
make_unique<so_5::disp::active_obj::impl::proxy_dispatcher_t,so_5::disp::active_obj::disp_params_t>
          (stdcpp *this,disp_params_t *args)

{
  proxy_dispatcher_t *this_00;
  disp_params_t local_40;
  disp_params_t *local_18;
  disp_params_t *args_local;
  
  local_18 = args;
  args_local = (disp_params_t *)this;
  this_00 = (proxy_dispatcher_t *)operator_new(0x58);
  so_5::disp::active_obj::disp_params_t::disp_params_t(&local_40,local_18);
  so_5::disp::active_obj::impl::proxy_dispatcher_t::proxy_dispatcher_t(this_00,&local_40);
  std::
  unique_ptr<so_5::disp::active_obj::impl::proxy_dispatcher_t,std::default_delete<so_5::disp::active_obj::impl::proxy_dispatcher_t>>
  ::unique_ptr<std::default_delete<so_5::disp::active_obj::impl::proxy_dispatcher_t>,void>
            ((unique_ptr<so_5::disp::active_obj::impl::proxy_dispatcher_t,std::default_delete<so_5::disp::active_obj::impl::proxy_dispatcher_t>>
              *)this,this_00);
  so_5::disp::active_obj::disp_params_t::~disp_params_t(&local_40);
  return (__uniq_ptr_data<so_5::disp::active_obj::impl::proxy_dispatcher_t,_std::default_delete<so_5::disp::active_obj::impl::proxy_dispatcher_t>,_true,_true>
          )(__uniq_ptr_data<so_5::disp::active_obj::impl::proxy_dispatcher_t,_std::default_delete<so_5::disp::active_obj::impl::proxy_dispatcher_t>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr< T >
make_unique( ARGS && ...args )
	{
		return std::unique_ptr< T >( new T( std::forward<ARGS>(args)... ) );
	}